

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O3

void __thiscall
slang::ast::Delay3Control::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
          (Delay3Control *this,SequenceMethodExprVisitor *visitor)

{
  Expression *pEVar1;
  
  Expression::
  visitExpression<slang::ast::Expression_const,slang::ast::builtins::SequenceMethodExprVisitor&>
            (this->expr1,this->expr1,visitor);
  pEVar1 = this->expr2;
  if (pEVar1 != (Expression *)0x0) {
    Expression::
    visitExpression<slang::ast::Expression_const,slang::ast::builtins::SequenceMethodExprVisitor&>
              (pEVar1,pEVar1,visitor);
  }
  pEVar1 = this->expr3;
  if (pEVar1 != (Expression *)0x0) {
    Expression::
    visitExpression<slang::ast::Expression_const,slang::ast::builtins::SequenceMethodExprVisitor&>
              (pEVar1,pEVar1,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr1.visit(visitor);
        if (expr2)
            expr2->visit(visitor);
        if (expr3)
            expr3->visit(visitor);
    }